

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void __thiscall tcmalloc::TestingPortalImpl::TestingPortalImpl(TestingPortalImpl *this)

{
  TestingPortalImpl *this_local;
  
  TestingPortal::TestingPortal(&this->super_TestingPortal);
  (this->super_TestingPortal)._vptr_TestingPortal = (_func_int **)&PTR_HaveSystemRelease_001467d0;
  return;
}

Assistant:

class ATTRIBUTE_VISIBILITY_HIDDEN TestingPortalImpl : public TestingPortal {
public:
  ~TestingPortalImpl() override = default;

  bool HaveSystemRelease() override {
    static bool have = ([] () {
      size_t actual;
      auto ptr = TCMalloc_SystemAlloc(kPageSize, &actual, 0);
      return TCMalloc_SystemRelease(ptr, actual);
    })();
    return have;
  }
  bool IsDebuggingMalloc() override {
    return false;
  }
  size_t GetPageSize() override {
    return kPageSize;
  }
  size_t GetMinAlign() override {
    return kMinAlign;
  }
  size_t GetMaxSize() override {
    return kMaxSize;
  }
  int64_t& GetSampleParameter() override {
    return FLAGS_tcmalloc_sample_parameter;
  }
  double& GetReleaseRate() override {
    return FLAGS_tcmalloc_release_rate;
  }
  int32_t& GetMaxFreeQueueSize() override {
    abort();
  }

  bool HasEmergencyMalloc() override {
    return kUseEmergencyMalloc;
  }

  bool IsEmergencyPtr(void* ptr) override {
    return tcmalloc::IsEmergencyPtr(ptr);
  }

  void WithEmergencyMallocEnabled(FunctionRef<void()> body) override {
    auto body_adaptor = [body] (bool stacktrace_allowed) {
      CHECK(stacktrace_allowed);
      body();
    };
    FunctionRef<void(bool)> ref{body_adaptor};
    ThreadCachePtr::WithStacktraceScope(ref.fn, ref.data);
  }

  static TestingPortalImpl* Get() {
    static TestingPortalImpl* ptr = ([] () {
      static StaticStorage<TestingPortalImpl> storage;
      return storage.Construct();
    }());
    return ptr;
  }
}